

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O1

void upb_MtDecoder_ParseMessage(upb_MtDecoder *d,char *data,size_t len)

{
  upb_Arena *puVar1;
  upb_MiniTable *puVar2;
  upb_SubCounts uVar3;
  upb_MiniTableField *puVar4;
  upb_MiniTableField *puVar5;
  upb_MiniTableSubInternal *puVar6;
  upb_MiniTable **ppuVar7;
  ulong uVar8;
  ushort uVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  upb_SubCounts sub_counts;
  upb_SubCounts local_2c;
  
  puVar1 = d->arena;
  uVar12 = len * 0xc + 7 & 0xfffffffffffffff8;
  puVar5 = (upb_MiniTableField *)puVar1->ptr_dont_copy_me__upb_internal_use_only;
  if ((ulong)((long)puVar1->end_dont_copy_me__upb_internal_use_only - (long)puVar5) < uVar12) {
    puVar5 = (upb_MiniTableField *)
             _upb_Arena_SlowMalloc_dont_copy_me__upb_internal_use_only(puVar1,uVar12);
  }
  else {
    if ((upb_MiniTableField *)((ulong)((long)&puVar5->presence + 1U) & 0xfffffffffffffff8) != puVar5
       ) goto LAB_00123d22;
    puVar1->ptr_dont_copy_me__upb_internal_use_only =
         (char *)((long)&puVar5->number_dont_copy_me__upb_internal_use_only + uVar12);
  }
  d->fields = puVar5;
  if (puVar5 != (upb_MiniTableField *)0x0) {
    local_2c.submsg_count = 0;
    local_2c.subenum_count = 0;
    puVar2 = d->table;
    puVar2->field_count_dont_copy_me__upb_internal_use_only = 0;
    puVar2->fields_dont_copy_me__upb_internal_use_only = puVar5;
    upb_MtDecoder_Parse(d,data,len,puVar5,0xc,
                        &puVar2->field_count_dont_copy_me__upb_internal_use_only,&local_2c);
    uVar3 = local_2c;
    puVar1 = d->arena;
    puVar5 = d->fields;
    if ((char *)((long)&puVar5->number_dont_copy_me__upb_internal_use_only + uVar12) !=
        puVar1->ptr_dont_copy_me__upb_internal_use_only) {
      __assert_fail("(char*)ptr + oldsize == a->ptr_dont_copy_me__upb_internal_use_only - 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/upb/mem/internal/arena.h"
                    ,0x68,"void upb_Arena_ShrinkLast(struct upb_Arena *, void *, size_t, size_t)");
    }
    puVar2 = d->table;
    uVar9 = puVar2->field_count_dont_copy_me__upb_internal_use_only;
    uVar8 = (ulong)(((uint)uVar9 + (uint)uVar9 * 2) * 4 + 7 & 0xfffffff8);
    if (uVar12 < uVar8) {
      __assert_fail("size <= oldsize",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/upb/mem/internal/arena.h"
                    ,0x69,"void upb_Arena_ShrinkLast(struct upb_Arena *, void *, size_t, size_t)");
    }
    puVar6 = (upb_MiniTableSubInternal *)
             ((long)&puVar5->number_dont_copy_me__upb_internal_use_only + uVar8);
    puVar1->ptr_dont_copy_me__upb_internal_use_only = (char *)puVar6;
    puVar2->fields_dont_copy_me__upb_internal_use_only = puVar5;
    uVar9 = local_2c.submsg_count;
    uVar10 = (uint)local_2c & 0xffff;
    uVar11 = ((uint)local_2c >> 0x10) + uVar10;
    uVar12 = (ulong)(uVar11 * 8);
    if ((ulong)((long)puVar1->end_dont_copy_me__upb_internal_use_only - (long)puVar6) < uVar12) {
      puVar6 = (upb_MiniTableSubInternal *)
               _upb_Arena_SlowMalloc_dont_copy_me__upb_internal_use_only(puVar1,uVar12);
    }
    else {
      if ((upb_MiniTableSubInternal *)((ulong)((long)puVar6 + 7U) & 0xfffffffffffffff8) != puVar6)
      goto LAB_00123d22;
      puVar1->ptr_dont_copy_me__upb_internal_use_only = (char *)(uVar12 + (long)puVar6);
    }
    puVar1 = d->arena;
    uVar12 = (ulong)(((uint)uVar3 & 0xffff) << 3);
    ppuVar7 = (upb_MiniTable **)puVar1->ptr_dont_copy_me__upb_internal_use_only;
    if ((ulong)((long)puVar1->end_dont_copy_me__upb_internal_use_only - (long)ppuVar7) < uVar12) {
      ppuVar7 = (upb_MiniTable **)
                _upb_Arena_SlowMalloc_dont_copy_me__upb_internal_use_only(puVar1,uVar12);
    }
    else {
      if ((upb_MiniTable **)((ulong)((long)ppuVar7 + 7U) & 0xfffffffffffffff8) != ppuVar7) {
LAB_00123d22:
        __assert_fail("((((uintptr_t)ret) + (8) - 1) / (8) * (8)) == (uintptr_t)ret",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/upb/mem/internal/arena.h"
                      ,0x3f,"void *upb_Arena_Malloc(struct upb_Arena *, size_t)");
      }
      puVar1->ptr_dont_copy_me__upb_internal_use_only = (char *)(uVar12 + (long)ppuVar7);
    }
    if ((puVar6 != (upb_MiniTableSubInternal *)0x0) && (ppuVar7 != (upb_MiniTable **)0x0)) {
      uVar12 = 0;
      if (uVar10 != 0) {
        do {
          *ppuVar7 = &_kUpb_MiniTable_Empty_dont_copy_me__upb_internal_use_only;
          puVar6[uVar12].submsg_dont_copy_me__upb_internal_use_only = ppuVar7;
          uVar12 = uVar12 + 1;
          ppuVar7 = ppuVar7 + 1;
        } while (uVar9 != uVar12);
      }
      if (0xffff < (uint)uVar3) {
        uVar8 = (ulong)d->table->field_count_dont_copy_me__upb_internal_use_only;
        if (uVar8 != 0) {
          puVar4 = d->fields;
          puVar5 = puVar4 + uVar8;
          do {
            if (puVar4->descriptortype_dont_copy_me__upb_internal_use_only == '\x0e') {
              puVar4->submsg_index_dont_copy_me__upb_internal_use_only =
                   puVar4->submsg_index_dont_copy_me__upb_internal_use_only + uVar9;
            }
            puVar4 = puVar4 + 1;
          } while (puVar4 < puVar5);
        }
        if ((uint)uVar12 < uVar11) {
          memset(puVar6 + (uVar12 & 0xffffffff),0,(ulong)(uVar11 + ~(uint)uVar12) * 8 + 8);
        }
      }
      d->table->subs_dont_copy_me__upb_internal_use_only = puVar6;
      return;
    }
  }
  upb_MdDecoder_ErrorJmp(&d->base,"Out of memory");
}

Assistant:

static void upb_MtDecoder_ParseMessage(upb_MtDecoder* d, const char* data,
                                       size_t len) {
  // Buffer length is an upper bound on the number of fields. We will return
  // what we don't use.
  d->fields = upb_Arena_Malloc(d->arena, sizeof(*d->fields) * len);
  upb_MdDecoder_CheckOutOfMemory(&d->base, d->fields);

  upb_SubCounts sub_counts = {0, 0};
  d->table->UPB_PRIVATE(field_count) = 0;
  d->table->UPB_PRIVATE(fields) = d->fields;
  upb_MtDecoder_Parse(d, data, len, d->fields, sizeof(*d->fields),
                      &d->table->UPB_PRIVATE(field_count), &sub_counts);

  upb_Arena_ShrinkLast(d->arena, d->fields, sizeof(*d->fields) * len,
                       sizeof(*d->fields) * d->table->UPB_PRIVATE(field_count));
  d->table->UPB_PRIVATE(fields) = d->fields;
  upb_MtDecoder_AllocateSubs(d, sub_counts);
}